

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

int __thiscall kj::anon_unknown_9::DiskFile::truncate(DiskFile *this,char *__file,__off_t __length)

{
  int iVar1;
  Fault f;
  Fault FStack_18;
  
  do {
    iVar1 = ftruncate64((this->super_DiskHandle).fd.fd,(__off64_t)__file);
    if (-1 < iVar1) {
      return iVar1;
    }
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 == 0) {
    return 0;
  }
  kj::_::Debug::Fault::Fault
            (&FStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
             ,0x1cc,iVar1,"ftruncate(fd, size)","");
  kj::_::Debug::Fault::fatal(&FStack_18);
}

Assistant:

void truncate(uint64_t size) const override {
    DiskHandle::truncate(size);
  }